

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_optimizeTrainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t *parameters)

{
  uint uVar1;
  uint displayLevel;
  uint uVar2;
  long lVar3;
  FASTCOVER_accel_t accelParams;
  ulong uVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  POOL_ctx *ctx_00;
  size_t sVar8;
  long *__ptr;
  clock_t cVar9;
  uint accel;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *__ptr_00;
  uint d;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  size_t sStackY_1f0;
  int local_198;
  undefined4 local_148;
  undefined4 uStack_144;
  FASTCOVER_ctx_t ctx;
  COVER_best_t best;
  
  uVar20 = -(ulong)(0.0 < parameters->splitPoint);
  uVar4 = (ulong)parameters->splitPoint & uVar20;
  uVar13 = parameters->k;
  uVar10 = parameters->d;
  bVar18 = uVar10 == 0;
  d = 6;
  if (!bVar18) {
    d = uVar10;
  }
  uVar15 = 8;
  if (!bVar18) {
    uVar15 = uVar10;
  }
  uVar10 = 0x28;
  if (parameters->steps != 0) {
    uVar10 = parameters->steps;
  }
  bVar19 = uVar13 != 0;
  uVar16 = 0x32;
  if (bVar19) {
    uVar16 = uVar13;
  }
  uVar12 = 2000;
  if (bVar19) {
    uVar12 = uVar13;
  }
  uVar13 = 0x79e;
  if (bVar19) {
    uVar13 = 0;
  }
  uVar11 = uVar13 / uVar10 + (uint)(uVar13 / uVar10 == 0);
  uVar14 = (uint)(ushort)((short)(uVar13 / uVar11) + 1) << bVar18;
  dVar5 = (double)(~uVar20 & 0x3fe8000000000000 | uVar4);
  uVar13 = 0x14;
  if (parameters->f != 0) {
    uVar13 = parameters->f;
  }
  uVar1 = parameters->accel;
  accel = uVar1 + (uVar1 == 0);
  displayLevel = (parameters->zParams).notificationLevel;
  if (dVar5 <= 1.0) {
    if (uVar1 < 0xb) {
      if (uVar16 < uVar15 || uVar12 < uVar16) {
        sVar8 = 0xffffffffffffffd6;
        if ((int)displayLevel < 1) {
          return 0xffffffffffffffd6;
        }
        __ptr_00 = "Incorrect k\n";
        sStackY_1f0 = 0xc;
      }
      else {
        if (nbSamples != 0) {
          if (0xff < dictBufferCapacity) {
            if (parameters->nbThreads < 2) {
              ctx_00 = (POOL_ctx *)0x0;
            }
            else {
              ctx_00 = POOL_create((ulong)parameters->nbThreads,1);
              if (ctx_00 == (POOL_ctx *)0x0) {
                return 0xffffffffffffffc0;
              }
            }
            COVER_best_init(&best);
            uVar1 = parameters->nbThreads;
            uVar2 = (parameters->zParams).dictID;
            lVar3 = *(long *)&parameters->zParams;
            accelParams = FASTCOVER_defaultAccelParameters[accel];
            g_displayLevel = displayLevel - 1;
            bVar18 = g_displayLevel != 0;
            if (displayLevel == 0) {
              g_displayLevel = 0;
            }
            if (bVar18 && 0 < (int)displayLevel) {
              fprintf(_stderr,"Trying %u different sets of parameters\n",(ulong)uVar14);
              fflush(_stderr);
            }
            local_198 = 1;
            bVar18 = true;
            do {
              local_148 = (undefined4)uVar4;
              uStack_144 = (undefined4)((ulong)dVar5 >> 0x20);
              if (uVar15 < d) {
                if (1 < (int)displayLevel) {
                  fprintf(_stderr,"\r%79s\r","");
                  fflush(_stderr);
                }
                sVar8 = best.compressedSize;
                if (best.compressedSize < 0xffffffffffffff89) {
                  parameters->k = best.parameters.k;
                  parameters->d = best.parameters.d;
                  parameters->steps = best.parameters.steps;
                  parameters->nbThreads = best.parameters.nbThreads;
                  parameters->splitPoint = best.parameters.splitPoint;
                  parameters->f = uVar13;
                  parameters->accel = accel;
                  (parameters->zParams).compressionLevel = best.parameters.zParams.compressionLevel;
                  (parameters->zParams).notificationLevel =
                       best.parameters.zParams.notificationLevel;
                  (parameters->zParams).dictID = best.parameters.zParams.dictID;
                  parameters->shrinkDict = best.parameters.shrinkDict;
                  memcpy(dictBuffer,best.dict,best.dictSize);
                  sVar8 = best.dictSize;
                }
LAB_001b146b:
                COVER_best_destroy(&best);
LAB_001b1383:
                POOL_free(ctx_00);
                return sVar8;
              }
              if (2 < (int)displayLevel) {
                fprintf(_stderr,"d=%u\n",(ulong)d);
                fflush(_stderr);
              }
              sVar8 = FASTCOVER_ctx_init(&ctx,samplesBuffer,samplesSizes,nbSamples,d,
                                         (double)CONCAT44(uStack_144,local_148),uVar13,accelParams);
              if (0xffffffffffffff88 < sVar8) {
                if (0 < (int)displayLevel) {
                  fwrite("Failed to initialize context\n",0x1d,1,_stderr);
                  fflush(_stderr);
                }
                goto LAB_001b146b;
              }
              uVar17 = uVar16;
              if (bVar18) {
                COVER_warnOnSmallCorpus(dictBufferCapacity,ctx.nbDmers,displayLevel);
              }
              for (; uVar17 <= uVar12; uVar17 = uVar17 + uVar11) {
                __ptr = (long *)malloc(0x48);
                if (2 < (int)displayLevel) {
                  fprintf(_stderr,"k=%u\n",(ulong)uVar17);
                  fflush(_stderr);
                }
                if (__ptr == (long *)0x0) {
                  if (0 < (int)displayLevel) {
                    fwrite("Failed to allocate parameters\n",0x1e,1,_stderr);
                    fflush(_stderr);
                  }
                  COVER_best_destroy(&best);
                  FASTCOVER_ctx_destroy(&ctx);
                  sVar8 = 0xffffffffffffffc0;
                  goto LAB_001b1383;
                }
                *__ptr = (long)&ctx;
                __ptr[1] = (long)&best;
                __ptr[2] = dictBufferCapacity;
                *(uint *)((long)__ptr + 0x24) = uVar1;
                *(undefined4 *)((long)__ptr + 0x34) = 0;
                __ptr[7] = lVar3;
                *(uint *)(__ptr + 8) = uVar2;
                *(undefined4 *)((long)__ptr + 0x44) = 0;
                *(uint *)(__ptr + 3) = uVar17;
                *(uint *)((long)__ptr + 0x1c) = d;
                __ptr[5] = (long)dVar5;
                *(uint *)(__ptr + 4) = uVar10;
                *(undefined4 *)(__ptr + 6) = 0;
                iVar6 = g_displayLevel;
                *(int *)((long)__ptr + 0x3c) = g_displayLevel;
                iVar7 = FASTCOVER_checkParameters
                                  (*(ZDICT_cover_params_t *)(__ptr + 3),dictBufferCapacity,ctx.f,
                                   accel);
                if (iVar7 == 0) {
                  if (0 < iVar6) {
                    fwrite("FASTCOVER parameters incorrect\n",0x1f,1,_stderr);
                    fflush(_stderr);
                  }
                  free(__ptr);
                }
                else {
                  COVER_best_start(&best);
                  if (ctx_00 == (POOL_ctx *)0x0) {
                    FASTCOVER_tryParameters(__ptr);
                  }
                  else {
                    POOL_add(ctx_00,FASTCOVER_tryParameters,__ptr);
                  }
                  if ((1 < (int)displayLevel) &&
                     ((cVar9 = clock(), 150000 < cVar9 - g_time || (3 < displayLevel)))) {
                    g_time = clock();
                    fprintf(_stderr,"\r%u%%       ",(ulong)(uint)(local_198 * 100) / (ulong)uVar14);
                    fflush(_stderr);
                  }
                  local_198 = local_198 + 1;
                }
              }
              COVER_best_wait(&best);
              FASTCOVER_ctx_destroy(&ctx);
              d = d + 2;
              bVar18 = false;
            } while( true );
          }
          sVar8 = 0xffffffffffffffba;
          if ((int)displayLevel < 1) {
            return 0xffffffffffffffba;
          }
          fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
          goto LAB_001b0f9e;
        }
        sVar8 = 0xffffffffffffffb8;
        if ((int)displayLevel < 1) {
          return 0xffffffffffffffb8;
        }
        __ptr_00 = "FASTCOVER must have at least one input file\n";
        sStackY_1f0 = 0x2c;
      }
    }
    else {
      sVar8 = 0xffffffffffffffd6;
      if ((int)displayLevel < 1) {
        return 0xffffffffffffffd6;
      }
      __ptr_00 = "Incorrect accel\n";
      sStackY_1f0 = 0x10;
    }
  }
  else {
    sVar8 = 0xffffffffffffffd6;
    if ((int)displayLevel < 1) {
      return 0xffffffffffffffd6;
    }
    __ptr_00 = "Incorrect splitPoint\n";
    sStackY_1f0 = 0x15;
  }
  fwrite(__ptr_00,sStackY_1f0,1,_stderr);
LAB_001b0f9e:
  fflush(_stderr);
  return sVar8;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_optimizeTrainFromBuffer_fastCover(
                    void* dictBuffer, size_t dictBufferCapacity,
                    const void* samplesBuffer,
                    const size_t* samplesSizes, unsigned nbSamples,
                    ZDICT_fastCover_params_t* parameters)
{
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* constants */
    const unsigned nbThreads = parameters->nbThreads;
    const double splitPoint =
        parameters->splitPoint <= 0.0 ? FASTCOVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
    const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
    const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
    const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
    const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
    const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
    const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
    const unsigned kIterations =
        (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
    const unsigned f = parameters->f == 0 ? DEFAULT_F : parameters->f;
    const unsigned accel = parameters->accel == 0 ? DEFAULT_ACCEL : parameters->accel;
    const unsigned shrinkDict = 0;
    /* Local variables */
    const int displayLevel = (int)parameters->zParams.notificationLevel;
    unsigned iteration = 1;
    unsigned d;
    unsigned k;
    COVER_best_t best;
    POOL_ctx *pool = NULL;
    int warned = 0;
    /* Checks */
    if (splitPoint <= 0 || splitPoint > 1) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect splitPoint\n");
      return ERROR(parameter_outOfBound);
    }
    if (accel == 0 || accel > FASTCOVER_MAX_ACCEL) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect accel\n");
      return ERROR(parameter_outOfBound);
    }
    if (kMinK < kMaxD || kMaxK < kMinK) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect k\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    if (nbThreads > 1) {
      pool = POOL_create(nbThreads, 1);
      if (!pool) {
        return ERROR(memory_allocation);
      }
    }
    /* Initialization */
    COVER_best_init(&best);
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(*parameters, &coverParams);
    accelParams = FASTCOVER_defaultAccelParameters[accel];
    /* Turn down global display level to clean up display at level 2 and below */
    g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
    /* Loop through d first because each new value needs a new context */
    LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                      kIterations);
    for (d = kMinD; d <= kMaxD; d += 2) {
      /* Initialize the context for this value of d */
      FASTCOVER_ctx_t ctx;
      LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
      {
        size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint, f, accelParams);
        if (ZSTD_isError(initVal)) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
          COVER_best_destroy(&best);
          POOL_free(pool);
          return initVal;
        }
      }
      if (!warned) {
        COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, displayLevel);
        warned = 1;
      }
      /* Loop through k reusing the same context */
      for (k = kMinK; k <= kMaxK; k += kStepSize) {
        /* Prepare the arguments */
        FASTCOVER_tryParameters_data_t *data = (FASTCOVER_tryParameters_data_t *)malloc(
            sizeof(FASTCOVER_tryParameters_data_t));
        LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
        if (!data) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
          COVER_best_destroy(&best);
          FASTCOVER_ctx_destroy(&ctx);
          POOL_free(pool);
          return ERROR(memory_allocation);
        }
        data->ctx = &ctx;
        data->best = &best;
        data->dictBufferCapacity = dictBufferCapacity;
        data->parameters = coverParams;
        data->parameters.k = k;
        data->parameters.d = d;
        data->parameters.splitPoint = splitPoint;
        data->parameters.steps = kSteps;
        data->parameters.shrinkDict = shrinkDict;
        data->parameters.zParams.notificationLevel = (unsigned)g_displayLevel;
        /* Check the parameters */
        if (!FASTCOVER_checkParameters(data->parameters, dictBufferCapacity,
                                       data->ctx->f, accel)) {
          DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
          free(data);
          continue;
        }
        /* Call the function and pass ownership of data to it */
        COVER_best_start(&best);
        if (pool) {
          POOL_add(pool, &FASTCOVER_tryParameters, data);
        } else {
          FASTCOVER_tryParameters(data);
        }
        /* Print status */
        LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                           (unsigned)((iteration * 100) / kIterations));
        ++iteration;
      }
      COVER_best_wait(&best);
      FASTCOVER_ctx_destroy(&ctx);
    }
    LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
    /* Fill the output buffer and parameters with output of the best parameters */
    {
      const size_t dictSize = best.dictSize;
      if (ZSTD_isError(best.compressedSize)) {
        const size_t compressedSize = best.compressedSize;
        COVER_best_destroy(&best);
        POOL_free(pool);
        return compressedSize;
      }
      FASTCOVER_convertToFastCoverParams(best.parameters, parameters, f, accel);
      memcpy(dictBuffer, best.dict, dictSize);
      COVER_best_destroy(&best);
      POOL_free(pool);
      return dictSize;
    }

}